

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slice_plane.cpp
# Opt level: O0

void polyscope::buildSlicePlaneGUI(void)

{
  bool bVar1;
  unique_ptr<polyscope::SlicePlane,_std::default_delete<polyscope::SlicePlane>_> *s;
  iterator __end2;
  iterator __begin2;
  vector<std::unique_ptr<polyscope::SlicePlane,_std::default_delete<polyscope::SlicePlane>_>,_std::allocator<std::unique_ptr<polyscope::SlicePlane,_std::default_delete<polyscope::SlicePlane>_>_>_>
  *__range2;
  bool in_stack_00000097;
  SlicePlane *in_stack_00000190;
  ImVec2 *in_stack_ffffffffffffffc8;
  __normal_iterator<std::unique_ptr<polyscope::SlicePlane,_std::default_delete<polyscope::SlicePlane>_>_*,_std::vector<std::unique_ptr<polyscope::SlicePlane,_std::default_delete<polyscope::SlicePlane>_>,_std::allocator<std::unique_ptr<polyscope::SlicePlane,_std::default_delete<polyscope::SlicePlane>_>_>_>_>
  *in_stack_ffffffffffffffd0;
  __normal_iterator<std::unique_ptr<polyscope::SlicePlane,_std::default_delete<polyscope::SlicePlane>_>_*,_std::vector<std::unique_ptr<polyscope::SlicePlane,_std::default_delete<polyscope::SlicePlane>_>,_std::allocator<std::unique_ptr<polyscope::SlicePlane,_std::default_delete<polyscope::SlicePlane>_>_>_>_>
  local_20;
  undefined1 *local_18;
  ImVec2 local_10;
  ImVec2 local_8;
  
  ImGui::SetNextTreeNodeOpen(false,0x45ed90);
  if ((openSlicePlaneMenu & 1) != 0) {
    ImGui::SetNextTreeNodeOpen(false,0x45eda8);
    openSlicePlaneMenu = 0;
  }
  bVar1 = ImGui::TreeNode((char *)in_stack_ffffffffffffffc8);
  if (bVar1) {
    ImVec2::ImVec2(&local_8,0.0,0.0);
    bVar1 = ImGui::Button((char *)in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
    if (bVar1) {
      addSceneSlicePlane(in_stack_00000097);
    }
    ImGui::SameLine((float)((ulong)in_stack_ffffffffffffffd0 >> 0x20),
                    SUB84(in_stack_ffffffffffffffd0,0));
    ImVec2::ImVec2(&local_10,0.0,0.0);
    bVar1 = ImGui::Button((char *)in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
    if (bVar1) {
      removeLastSceneSlicePlane();
    }
    local_18 = state::slicePlanes;
    local_20._M_current =
         (unique_ptr<polyscope::SlicePlane,_std::default_delete<polyscope::SlicePlane>_> *)
         std::
         vector<std::unique_ptr<polyscope::SlicePlane,_std::default_delete<polyscope::SlicePlane>_>,_std::allocator<std::unique_ptr<polyscope::SlicePlane,_std::default_delete<polyscope::SlicePlane>_>_>_>
         ::begin((vector<std::unique_ptr<polyscope::SlicePlane,_std::default_delete<polyscope::SlicePlane>_>,_std::allocator<std::unique_ptr<polyscope::SlicePlane,_std::default_delete<polyscope::SlicePlane>_>_>_>
                  *)in_stack_ffffffffffffffc8);
    std::
    vector<std::unique_ptr<polyscope::SlicePlane,_std::default_delete<polyscope::SlicePlane>_>,_std::allocator<std::unique_ptr<polyscope::SlicePlane,_std::default_delete<polyscope::SlicePlane>_>_>_>
    ::end((vector<std::unique_ptr<polyscope::SlicePlane,_std::default_delete<polyscope::SlicePlane>_>,_std::allocator<std::unique_ptr<polyscope::SlicePlane,_std::default_delete<polyscope::SlicePlane>_>_>_>
           *)in_stack_ffffffffffffffc8);
    while (bVar1 = __gnu_cxx::operator!=
                             (in_stack_ffffffffffffffd0,
                              (__normal_iterator<std::unique_ptr<polyscope::SlicePlane,_std::default_delete<polyscope::SlicePlane>_>_*,_std::vector<std::unique_ptr<polyscope::SlicePlane,_std::default_delete<polyscope::SlicePlane>_>,_std::allocator<std::unique_ptr<polyscope::SlicePlane,_std::default_delete<polyscope::SlicePlane>_>_>_>_>
                               *)in_stack_ffffffffffffffc8), bVar1) {
      in_stack_ffffffffffffffd0 =
           (__normal_iterator<std::unique_ptr<polyscope::SlicePlane,_std::default_delete<polyscope::SlicePlane>_>_*,_std::vector<std::unique_ptr<polyscope::SlicePlane,_std::default_delete<polyscope::SlicePlane>_>,_std::allocator<std::unique_ptr<polyscope::SlicePlane,_std::default_delete<polyscope::SlicePlane>_>_>_>_>
            *)__gnu_cxx::
              __normal_iterator<std::unique_ptr<polyscope::SlicePlane,_std::default_delete<polyscope::SlicePlane>_>_*,_std::vector<std::unique_ptr<polyscope::SlicePlane,_std::default_delete<polyscope::SlicePlane>_>,_std::allocator<std::unique_ptr<polyscope::SlicePlane,_std::default_delete<polyscope::SlicePlane>_>_>_>_>
              ::operator*(&local_20);
      std::unique_ptr<polyscope::SlicePlane,_std::default_delete<polyscope::SlicePlane>_>::
      operator->((unique_ptr<polyscope::SlicePlane,_std::default_delete<polyscope::SlicePlane>_> *)
                 0x45ee95);
      SlicePlane::buildGUI(in_stack_00000190);
      __gnu_cxx::
      __normal_iterator<std::unique_ptr<polyscope::SlicePlane,_std::default_delete<polyscope::SlicePlane>_>_*,_std::vector<std::unique_ptr<polyscope::SlicePlane,_std::default_delete<polyscope::SlicePlane>_>,_std::allocator<std::unique_ptr<polyscope::SlicePlane,_std::default_delete<polyscope::SlicePlane>_>_>_>_>
      ::operator++(&local_20);
    }
    ImGui::TreePop();
  }
  return;
}

Assistant:

void buildSlicePlaneGUI() {


  ImGui::SetNextTreeNodeOpen(false, ImGuiCond_FirstUseEver);
  if (openSlicePlaneMenu) {
    ImGui::SetNextTreeNodeOpen(true);
    openSlicePlaneMenu = false;
  }
  if (ImGui::TreeNode("Slice Planes")) {
    if (ImGui::Button("Add plane")) {
      addSceneSlicePlane(true);
    }
    ImGui::SameLine();
    if (ImGui::Button("Remove plane")) {
      removeLastSceneSlicePlane();
    }
    for (std::unique_ptr<SlicePlane>& s : state::slicePlanes) {
      s->buildGUI();
    }
    ImGui::TreePop();
  }
}